

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ep.c
# Opt level: O1

void nn_ep_stopped(nn_ep *self)

{
  (self->fsm).stopped.fsm = &self->fsm;
  (self->fsm).stopped.src = -2;
  (self->fsm).stopped.srcptr = (void *)0x0;
  (self->fsm).stopped.type = 1;
  nn_ctx_raise((self->fsm).ctx,&(self->fsm).stopped);
  return;
}

Assistant:

void nn_ep_stopped (struct nn_ep *self)
{
    /*  TODO: Do the following in a more sane way. */
    self->fsm.stopped.fsm = &self->fsm;
    self->fsm.stopped.src = NN_FSM_ACTION;
    self->fsm.stopped.srcptr = NULL;
    self->fsm.stopped.type = NN_EP_ACTION_STOPPED;
    nn_ctx_raise (self->fsm.ctx, &self->fsm.stopped);
}